

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O1

void __thiscall cppcms::forwarder::forwarder(forwarder *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->rules_)._M_t._M_impl.super__Rb_tree_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  booster::shared_mutex::shared_mutex(&this->mutex_);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

forwarder::forwarder()
	{
	}